

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-precede.cpp
# Opt level: O1

void __thiscall seq_precede_inc::seq_precede_inc(seq_precede_inc *this,vec<IntVar_*> *_xs)

{
  uint uVar1;
  long *plVar2;
  long lVar3;
  IntVar *pIVar4;
  uint uVar5;
  uint uVar6;
  vec<TrailElem> *pvVar7;
  int iVar8;
  char cVar9;
  int *pt_5;
  Tint *pTVar10;
  int iVar11;
  int *pt_4;
  int *pt_2;
  uint uVar12;
  int *pt;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  TrailElem local_60;
  vec<TrailElem> *local_50;
  ulong local_48;
  long local_40;
  vec<TrailElem> *local_38;
  
  (this->super_Propagator)._vptr_Propagator = (_func_int **)&PTR__Propagator_0020fe18;
  (this->super_Propagator).prop_id = engine.propagators.sz;
  (this->super_Propagator).priority = 0;
  (this->super_Propagator).satisfied = '\0';
  (this->super_Propagator).in_queue = false;
  local_60.pt = (int *)this;
  vec<Propagator_*>::push(&engine.propagators,(Propagator **)&local_60);
  (this->super_Propagator)._vptr_Propagator = (_func_int **)&PTR__seq_precede_inc_00210bc0;
  vec<IntVar*>::vec<IntVar*>((vec<IntVar*> *)&this->xs,_xs);
  local_60.pt = (int *)((ulong)local_60.pt & 0xffffffff00000000);
  vec<Tint>::vec(&this->first,(this->xs).sz + 1,(Tint *)&local_60);
  uVar12 = (this->xs).sz;
  local_60.pt._0_4_ = uVar12;
  vec<Tint>::vec(&this->limit,uVar12 + 1,(Tint *)&local_60);
  local_60.pt._0_4_ = 0;
  vec<Tint>::vec(&this->first_val,(this->xs).sz,(Tint *)&local_60);
  uVar12 = (this->xs).sz;
  local_60.pt = (int *)CONCAT44(local_60.pt._4_4_,uVar12);
  vec<Tint>::vec(&this->limit_val,uVar12,(Tint *)&local_60);
  uVar12 = (this->xs).sz;
  lVar16 = (long)(int)uVar12;
  (this->max_val).v = uVar12;
  this->max_def = 0;
  (this->first_change).sz = 0;
  *(undefined8 *)&(this->first_change).cap = 0;
  *(undefined8 *)((long)&(this->first_change).data + 4) = 0;
  *(undefined8 *)&(this->limit_change).cap = 0;
  *(undefined4 *)((long)&(this->limit_change).data + 4) = 0;
  (this->super_Propagator).priority = 3;
  pTVar10 = (this->first).data;
  local_60.x = pTVar10->v;
  local_60.sz = 4;
  local_60.pt = &pTVar10->v;
  vec<TrailElem>::push(&engine.trail,&local_60);
  pTVar10->v = -1;
  uVar15 = (this->xs).sz;
  pTVar10 = (this->limit).data;
  local_60.x = pTVar10->v;
  local_60.sz = 4;
  local_60.pt = &pTVar10->v;
  vec<TrailElem>::push(&engine.trail,&local_60);
  pTVar10->v = uVar15 + 1;
  iVar11 = 0;
  if (0 < lVar16) {
    local_40 = lVar16 * 4;
    uVar15 = 1;
    lVar13 = 0;
    local_50 = &engine.trail;
    iVar11 = 0;
    do {
      plVar2 = *(long **)((long)(this->xs).data + lVar13 * 2);
      if (((int)uVar15 < (int)plVar2[2]) &&
         (cVar9 = (**(code **)(*plVar2 + 0x78))(plVar2,(long)(int)uVar15,0,1), cVar9 == '\0'))
      goto LAB_00170896;
      pvVar7 = local_50;
      lVar3 = *(long *)((long)(this->xs).data + lVar13 * 2);
      if (((*(int *)(lVar3 + 0xc) <= (int)uVar15) && ((int)uVar15 <= *(int *)(lVar3 + 0x10))) &&
         ((*(long *)(lVar3 + 0x28) == 0 ||
          (*(char *)(*(long *)(lVar3 + 0x28) + (long)(int)uVar15) != '\0')))) {
        pTVar10 = (this->first).data + uVar15;
        local_60.x = pTVar10->v;
        local_60.sz = 4;
        local_48 = CONCAT44(local_48._4_4_,uVar15);
        local_60.pt = &pTVar10->v;
        vec<TrailElem>::push(local_50,&local_60);
        pTVar10->v = iVar11;
        pTVar10 = (this->first_val).data;
        local_60.pt = (int *)((long)&pTVar10->v + lVar13);
        local_60.x = *(int *)((long)&pTVar10->v + lVar13);
        local_60.sz = 4;
        iVar8 = (int)local_48;
        vec<TrailElem>::push(pvVar7,&local_60);
        *(int *)((long)&pTVar10->v + lVar13) = iVar8;
        uVar15 = iVar8 + 1;
      }
      plVar2 = *(long **)((long)(this->xs).data + lVar13 * 2);
      (**(code **)(*plVar2 + 0x38))(plVar2,this,iVar11,1);
      iVar11 = iVar11 + 1;
      lVar13 = lVar13 + 4;
    } while (local_40 != lVar13);
    iVar11 = uVar15 - 1;
  }
  pTVar10 = &this->max_val;
  local_60.x = pTVar10->v;
  local_60.sz = 4;
  local_38 = &engine.trail;
  local_60.pt = &pTVar10->v;
  vec<TrailElem>::push(&engine.trail,&local_60);
  pvVar7 = local_38;
  pTVar10->v = iVar11;
  uVar15 = 0;
  if (0 < (int)uVar12) {
    lVar13 = lVar16 + 1;
    uVar12 = 0;
    uVar15 = 0;
    lVar16 = lVar16 * 4;
    do {
      pIVar4 = (this->xs).data[lVar13 + -2];
      uVar1 = (pIVar4->min).v;
      uVar5 = uVar15;
      if ((int)uVar15 < (int)uVar1) {
        uVar5 = uVar1;
      }
      uVar6 = uVar12;
      if ((int)uVar12 < (int)uVar1) {
        uVar6 = uVar1;
        uVar15 = uVar5;
      }
      uVar14 = (ulong)uVar6;
      uVar12 = 0;
      if (((uVar6 != 0) && (uVar12 = uVar6, (int)uVar6 <= (pIVar4->max).v)) &&
         ((pIVar4->vals == (Tchar *)0x0 || (pIVar4->vals[uVar14].v != '\0')))) {
        local_50 = (vec<TrailElem> *)(lVar13 + -2);
        local_40 = CONCAT44(local_40._4_4_,uVar15);
        pTVar10 = (this->limit).data + uVar14;
        local_60.x = pTVar10->v;
        local_60.sz = 4;
        local_60.pt = &pTVar10->v;
        local_48 = uVar14;
        vec<TrailElem>::push(pvVar7,&local_60);
        pTVar10->v = (int)lVar13 + -2;
        pTVar10 = (this->limit_val).data;
        local_60.pt = (int *)((long)&pTVar10[-1].v + lVar16);
        local_60.x = pTVar10[lVar13 + -2].v;
        local_60.sz = 4;
        vec<TrailElem>::push(pvVar7,&local_60);
        pTVar10[lVar13 + -2].v = uVar6;
        uVar15 = (uint)local_40;
        if (((local_50 == (vec<TrailElem> *)(ulong)(uint)(this->first).data[local_48].v) &&
            (pIVar4 = (this->xs).data[lVar13 + -2], (pIVar4->min).v < (int)uVar6)) &&
           (iVar11 = (*(pIVar4->super_Var).super_Branching._vptr_Branching[0xe])
                               (pIVar4,local_48,0,1), (char)iVar11 == '\0')) {
LAB_00170896:
          puts("=====UNSATISFIABLE=====");
          printf("%% Top level failure!\n");
          exit(0);
        }
        uVar12 = uVar6 - 1;
      }
      lVar13 = lVar13 + -1;
      lVar16 = lVar16 + -4;
    } while (1 < lVar13);
  }
  pTVar10 = &this->max_def;
  local_60.x = pTVar10->v;
  local_60.sz = 4;
  local_60.pt = &pTVar10->v;
  vec<TrailElem>::push(local_38,&local_60);
  pTVar10->v = uVar15;
  return;
}

Assistant:

seq_precede_inc(vec<IntVar*>& _xs)
			: xs(_xs),
				first(xs.size() + 1, 0),
				limit(xs.size() + 1, xs.size()),
				first_val(xs.size(), 0),
				limit_val(xs.size(), xs.size()),
				max_val(xs.size()),
				max_def(0) {
		const int sz = xs.size();
		priority = 3;

		// Set unused zero value out of range
		first[0] = -1;
		limit[0] = xs.size() + 1;

		int M = 1;
		// Initialize firsts.
		for (int ii = 0; ii < sz; ii++) {
			if (xs[ii]->setMaxNotR(M)) {
				if (!xs[ii]->setMax(M)) {
					TL_FAIL();
				}
			}
			if (xs[ii]->indomain(M)) {
				first[M] = ii;
				first_val[ii] = M;
				++M;
			}
			xs[ii]->attach(this, ii, EVENT_C);
		}
		max_val = M - 1;

		// check_firsts();

		// Initialize lasts.
		int m = 0;
		int k = 0;
		for (int ii = sz - 1; ii >= 0; --ii) {
			const int mx = xs[ii]->getMin();
			if (mx > k) {
				k = mx;
				if (mx > m) {
					m = mx;
				}
			}
			if ((k != 0) && xs[ii]->indomain(k)) {
				limit[k] = ii;
				limit_val[ii] = k;
				// Definite occurrence
				if (first[k] == ii && xs[ii]->setMinNotR(k)) {
					if (!xs[ii]->setMin(k)) {
						TL_FAIL();
					}
				}
				--k;
			}
		}
		max_def = m;
	}